

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O0

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::tokenize<char>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          char *formula,size_t size,Options<char> *options)

{
  Type type_00;
  char *pcVar1;
  size_t sVar2;
  syntax_option_type __f;
  invalid_formula *piVar3;
  optional<char> *poVar4;
  ostream *poVar5;
  reference pvVar6;
  __tuple_element_t<0UL,_tuple<Type,_Subtype>_> *p_Var7;
  __tuple_element_t<1UL,_tuple<Type,_Subtype>_> *p_Var8;
  reference this;
  size_t sVar9;
  bool bVar10;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_6c0;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_6a8;
  Token local_690;
  Token local_678;
  undefined1 local_65a;
  allocator<char> local_659;
  string local_658;
  Token local_638;
  Token local_620;
  undefined4 local_608;
  Subtype local_604 [3];
  tuple<xlfparser::Token::Type,_xlfparser::Token::Subtype> local_5f8;
  tuple<xlfparser::Token::Type,_xlfparser::Token::Subtype> type;
  value_type local_5d4;
  Token local_5d0;
  value_type local_5b4;
  Token local_5b0;
  Token local_598;
  Token local_580;
  char *local_568;
  char *op_2;
  Token local_548;
  char *local_530;
  char *op_1;
  undefined1 local_520 [7];
  bool foundOp;
  Token local_508;
  long *local_4f0;
  char **op;
  undefined1 local_4e0 [7];
  bool foundOp_1;
  Token local_4c8;
  Token local_4b0;
  Token local_498;
  undefined1 local_47a;
  allocator<char> local_479;
  string local_478;
  Token local_458;
  value_type local_43c;
  Token local_438;
  Token local_420;
  Token local_408;
  value_type local_3f0 [2];
  Token local_3e8;
  Token local_3d0;
  Token local_3b8;
  Token local_3a0;
  Token local_388;
  Token local_370;
  Token local_358;
  char **local_340;
  char **err;
  size_t local_320;
  size_t start;
  size_t index;
  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
  stack;
  bool in_error;
  bool in_range;
  bool in_path;
  char *pcStack_2b8;
  bool in_string;
  char *COMPARATORS_MULTI [4];
  char *ERRORS [9];
  undefined1 local_230 [8];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> sn_regex;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> sn_regex_ss;
  ostream local_200 [376];
  char *local_88;
  char *OPERATORS_POSTFIX;
  char *OPERATORS_INFIX;
  char local_70;
  char local_6f;
  char local_6e;
  char local_6d;
  char local_6c;
  char local_6b;
  char local_6a;
  char local_69;
  char row_separator;
  char local_67;
  char decimal_separator;
  char local_65;
  char list_separator;
  undefined1 local_63;
  char right_bracket;
  undefined1 local_61;
  char left_bracket;
  undefined1 local_5f;
  char right_brace;
  undefined1 local_5d;
  char left_brace;
  char ERROR_START;
  char WHITESPACE;
  char PAREN_CLOSE;
  char PAREN_OPEN;
  char QUOTE_SINGLE;
  char QUOTE_DOUBLE;
  allocator<char> local_49;
  string local_48;
  Options<char> *local_28;
  Options<char> *options_local;
  size_t size_local;
  char *formula_local;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens;
  
  local_28 = options;
  options_local = (Options<char> *)size;
  size_local = (size_t)formula;
  formula_local = (char *)__return_storage_ptr__;
  if ((size < 2) || (*formula != '=')) {
    local_5d = 1;
    piVar3 = (invalid_formula *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Invalid Excel formula",&local_49);
    invalid_formula::invalid_formula(piVar3,&local_48);
    local_5d = 0;
    __cxa_throw(piVar3,&invalid_formula::typeinfo,invalid_formula::~invalid_formula);
  }
  right_brace = '\"';
  local_5f = 0x27;
  left_bracket = '(';
  local_61 = 0x29;
  right_bracket = ' ';
  local_63 = 0x23;
  local_65 = _choose_char<char>('{',L'{');
  list_separator = std::optional<char>::value_or<char>(&options->left_brace,&local_65);
  poVar4 = &local_28->right_brace;
  local_67 = _choose_char<char>('}',L'}');
  decimal_separator = std::optional<char>::value_or<char>(poVar4,&local_67);
  poVar4 = &local_28->left_bracket;
  local_69 = _choose_char<char>('[',L'[');
  row_separator = std::optional<char>::value_or<char>(poVar4,&local_69);
  poVar4 = &local_28->right_brace;
  local_6b = _choose_char<char>(']',L']');
  local_6a = std::optional<char>::value_or<char>(poVar4,&local_6b);
  poVar4 = &local_28->list_separator;
  local_6d = _choose_char<char>(',',L',');
  local_6c = std::optional<char>::value_or<char>(poVar4,&local_6d);
  poVar4 = &local_28->decimal_separator;
  local_6f = _choose_char<char>('.',L'.');
  local_6e = std::optional<char>::value_or<char>(poVar4,&local_6f);
  poVar4 = &local_28->row_separator;
  OPERATORS_INFIX._7_1_ = _choose_char<char>(';',L';');
  local_70 = std::optional<char>::value_or<char>(poVar4,(char *)((long)&OPERATORS_INFIX + 7));
  OPERATORS_POSTFIX = _choose_string<char>("+-*/^&=><@",L"+-*/^&=><@");
  local_88 = _choose_string<char>("%",L"%");
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &sn_regex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  poVar5 = std::operator<<(local_200,"^[1-9](\\");
  poVar5 = std::operator<<(poVar5,local_6e);
  std::operator<<(poVar5,"\\d+)?E[+-]\\d*$");
  std::__cxx11::stringstream::str();
  __f = std::regex_constants::operator|(0x10,1);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ERRORS + 8),__f);
  std::__cxx11::string::~string((string *)(ERRORS + 8));
  ERRORS[7] = (char *)0x0;
  ERRORS[5] = "#N/A";
  ERRORS[6] = "#SPILL!";
  ERRORS[3] = "#NAME?";
  ERRORS[4] = "#NUM!";
  ERRORS[1] = "#VALUE!";
  ERRORS[2] = "#REF!";
  COMPARATORS_MULTI[3] = "#NULL!";
  ERRORS[0] = "#DIV/0!";
  COMPARATORS_MULTI[1] = "<>";
  COMPARATORS_MULTI[2] = (char *)0x0;
  pcStack_2b8 = ">=";
  COMPARATORS_MULTI[0] = "<=";
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._6_1_ = 0;
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._5_1_ = 0;
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._4_1_ = 0;
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._3_1_ = 0;
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector(__return_storage_ptr__);
  std::
  stack<xlfparser::Token::Type,std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>>
  ::stack<std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>,void>
            ((stack<xlfparser::Token::Type,std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>>
              *)&index);
  start = 1;
  local_320 = 1;
LAB_00108365:
  do {
    bVar10 = false;
    if (start < options_local) {
      bVar10 = *(char *)(size_local + start) != '\0';
    }
    if (!bVar10) {
      if (local_320 < start) {
        bVar10 = std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::empty
                           (__return_storage_ptr__);
        if (!bVar10) {
          this = std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::back
                           (__return_storage_ptr__);
          sVar9 = Token::end(this);
          if (local_320 <= sVar9) goto LAB_00109882;
        }
        Token::Token(&local_690,local_320,start - 1,Operand,None);
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                  (__return_storage_ptr__,&local_690);
      }
LAB_00109882:
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector
                (&local_6c0,__return_storage_ptr__);
      _fix_whitespace_tokens<char>(&local_6a8,&local_6c0,(char *)size_local,(size_t)options_local);
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::operator=
                (__return_storage_ptr__,&local_6a8);
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~vector(&local_6a8);
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~vector(&local_6c0);
      _infer_token_subtypes<char>
                (__return_storage_ptr__,local_28,(char *)size_local,(size_t)options_local);
      stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_node._3_1_ = 1;
      std::
      stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
      ::~stack((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                *)&index);
      if ((stack.c.
           super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_node._3_1_ & 1) == 0) {
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~vector
                  (__return_storage_ptr__);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_230);
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)
                 &sn_regex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return __return_storage_ptr__;
    }
    if ((stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
      if (*(char *)(size_local + start) == '\"') {
        if ((options_local < (Options<char> *)(start + 2)) ||
           (*(char *)(size_local + 1 + start) != '\"')) {
          Token::Token((Token *)&err,local_320,start,Operand,Text);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,(value_type *)&err);
          local_320 = start + 1;
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
          start = local_320;
        }
        else {
          start = start + 2;
        }
      }
      else {
        start = start + 1;
      }
      goto LAB_00108365;
    }
    if ((stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ & 1) != 0) {
      if (*(char *)(size_local + start) == '\'') {
        if (((Options<char> *)(start + 2) <= options_local) &&
           (*(char *)(size_local + 1 + start) == '\'')) {
          start = start + 2;
          goto LAB_00108365;
        }
        stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ = 0;
      }
      start = start + 1;
      goto LAB_00108365;
    }
    if ((stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node._5_1_ & 1) == 0) {
      if ((stack.c.
           super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ & 1) == 0) {
        if ((local_320 < start) &&
           (bVar10 = std::regex_match<char_const*,char,std::__cxx11::regex_traits<char>>
                               ((char *)(size_local + local_320),(char *)(size_local + 1 + start),
                                (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_230,0)
           , bVar10)) {
          start = start + 1;
        }
        else if (*(char *)(size_local + start) == '\"') {
          if (local_320 < start) {
            Token::Token(&local_370,local_320,start - 1,Unknown,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_370);
            local_320 = start;
          }
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
          start = start + 1;
        }
        else if (*(char *)(size_local + start) == '\'') {
          if (local_320 < start) {
            Token::Token(&local_388,local_320,start - 1,Unknown,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_388);
            local_320 = start;
          }
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ = 1;
          start = start + 1;
        }
        else if (*(char *)(size_local + start) == row_separator) {
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._5_1_ = 1;
          start = start + 1;
        }
        else if (*(char *)(size_local + start) == '#') {
          if (local_320 < start) {
            Token::Token(&local_3a0,local_320,start - 1,Unknown,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_3a0);
            local_320 = start;
          }
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ = 1;
          start = start + 1;
        }
        else if (*(char *)(size_local + start) == list_separator) {
          if (local_320 < start) {
            Token::Token(&local_3b8,local_320,start - 1,Unknown,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_3b8);
            local_320 = start;
          }
          Token::Token(&local_3d0,local_320,start,Array,Start);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_3d0);
          Token::Token(&local_3e8,local_320,start,ArrayRow,Start);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_3e8);
          local_3f0[1] = 3;
          std::
          stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
          ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                  *)&index,local_3f0 + 1);
          local_3f0[0] = ArrayRow;
          std::
          stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
          ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                  *)&index,local_3f0);
          local_320 = start + 1;
          start = local_320;
        }
        else {
          if (((*(char *)(size_local + start) == local_70) &&
              (bVar10 = std::
                        stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                        ::empty((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                 *)&index), !bVar10)) &&
             (pvVar6 = std::
                       stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                       ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                              *)&index), *pvVar6 == ArrayRow)) {
            if (local_320 < start) {
              Token::Token(&local_408,local_320,start - 1,Operand,None);
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                        (__return_storage_ptr__,&local_408);
              local_320 = start;
            }
            sVar2 = start;
            sVar9 = local_320;
            pvVar6 = std::
                     stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                     ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                            *)&index);
            Token::Token(&local_420,sVar9,sVar2,*pvVar6,Stop);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_420);
            std::
            stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
            ::pop((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                   *)&index);
            Token::Token(&local_438,local_320,start,ArrayRow,Start);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_438);
            local_43c = ArrayRow;
            std::
            stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
            ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                    *)&index,&local_43c);
            local_320 = start + 1;
            start = local_320;
            goto LAB_00108365;
          }
          if (*(char *)(size_local + start) != decimal_separator) {
            if (*(char *)(size_local + start) == ' ') {
              if (local_320 < start) {
                Token::Token(&local_4c8,local_320,start - 1,Operand,None);
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                          (__return_storage_ptr__,&local_4c8);
                local_320 = start;
              }
              for (; *(char *)(size_local + start) == ' ' && start < options_local;
                  start = start + 1) {
              }
              Token::Token((Token *)local_4e0,local_320,start - 1,Whitespace,None);
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                        (__return_storage_ptr__,(value_type *)local_4e0);
              local_320 = start;
              goto LAB_00108365;
            }
            if ((Options<char> *)(start + 2) <= options_local) {
              op._7_1_ = 0;
              for (local_4f0 = (long *)&stack0xfffffffffffffd48; *local_4f0 != 0;
                  local_4f0 = local_4f0 + 1) {
                pcVar1 = (char *)*local_4f0;
                sVar9 = _tcslen(pcVar1);
                bVar10 = _str_equals(pcVar1,sVar9,(char *)(size_local + start),2);
                if (bVar10) {
                  if (local_320 < start) {
                    Token::Token(&local_508,local_320,start - 1,Operand,None);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_508);
                    local_320 = start;
                  }
                  Token::Token((Token *)local_520,local_320,start + 1,OperatorInfix,Logical);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,(value_type *)local_520);
                  op._7_1_ = 1;
                  break;
                }
              }
              if ((op._7_1_ & 1) != 0) {
                local_320 = start + 2;
                start = local_320;
                goto LAB_00108365;
              }
            }
            op_1._7_1_ = '\0';
            for (local_530 = OPERATORS_POSTFIX; *local_530 != '\0'; local_530 = local_530 + 1) {
              if (*local_530 == *(char *)(size_local + start)) {
                if (local_320 < start) {
                  Token::Token(&local_548,local_320,start - 1,Operand,None);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,&local_548);
                  local_320 = start;
                }
                Token::Token((Token *)&op_2,local_320,start,OperatorInfix,None);
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                          (__return_storage_ptr__,(value_type *)&op_2);
                op_1._7_1_ = '\x01';
                break;
              }
            }
            if (op_1._7_1_ == '\0') {
              for (local_568 = local_88; *local_568 != '\0'; local_568 = local_568 + 1) {
                if (*local_568 == *(char *)(size_local + start)) {
                  if (local_320 < start) {
                    Token::Token(&local_580,local_320,start - 1,Operand,None);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_580);
                    local_320 = start;
                  }
                  Token::Token(&local_598,local_320,start,OperatorPostfix,None);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,&local_598);
                  op_1._7_1_ = '\x01';
                  break;
                }
              }
              if (op_1._7_1_ == '\0') {
                if (*(char *)(size_local + start) == '(') {
                  if (local_320 < start) {
                    Token::Token(&local_5b0,local_320,start - 1,Function,Start);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_5b0);
                    local_5b4 = Function;
                    std::
                    stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                    ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                            *)&index,&local_5b4);
                  }
                  else {
                    Token::Token(&local_5d0,local_320,start,Subexpression,Start);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_5d0);
                    local_5d4 = Subexpression;
                    std::
                    stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                    ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                            *)&index,&local_5d4);
                  }
                  local_320 = start + 1;
                  start = local_320;
                }
                else if (*(char *)(size_local + start) == local_6c) {
                  if (local_320 < start) {
                    Token::Token((Token *)&type,local_320,start - 1,Operand,None);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,(value_type *)&type);
                    local_320 = start;
                  }
                  bVar10 = std::
                           stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                           ::empty((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                    *)&index);
                  if ((bVar10) ||
                     (pvVar6 = std::
                               stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                               ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                      *)&index), *pvVar6 != Function)) {
                    local_604[0] = Math;
                    local_608 = 0xb;
                    std::make_tuple<xlfparser::Token::Type,xlfparser::Token::Subtype>
                              ((Type *)&local_5f8,local_604);
                  }
                  else {
                    local_604[2] = 6;
                    local_604[1] = 0;
                    std::make_tuple<xlfparser::Token::Type,xlfparser::Token::Subtype>
                              ((Type *)&local_5f8,local_604 + 2);
                  }
                  sVar2 = start;
                  sVar9 = local_320;
                  p_Var7 = std::get<0ul,xlfparser::Token::Type,xlfparser::Token::Subtype>
                                     (&local_5f8);
                  type_00 = *p_Var7;
                  p_Var8 = std::get<1ul,xlfparser::Token::Type,xlfparser::Token::Subtype>
                                     (&local_5f8);
                  Token::Token(&local_620,sVar9,sVar2,type_00,*p_Var8);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,&local_620);
                  local_320 = start + 1;
                  start = local_320;
                }
                else if (*(char *)(size_local + start) == ')') {
                  if (local_320 < start) {
                    Token::Token(&local_638,local_320,start - 1,Operand,None);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_638);
                    local_320 = start;
                  }
                  bVar10 = std::
                           stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                           ::empty((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                    *)&index);
                  sVar2 = start;
                  sVar9 = local_320;
                  if (bVar10) {
                    local_65a = 1;
                    piVar3 = (invalid_formula *)__cxa_allocate_exception(0x10);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_658,"Mismatched parentheses",&local_659);
                    invalid_formula::invalid_formula(piVar3,&local_658);
                    local_65a = 0;
                    __cxa_throw(piVar3,&invalid_formula::typeinfo,invalid_formula::~invalid_formula)
                    ;
                  }
                  pvVar6 = std::
                           stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                           ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                  *)&index);
                  Token::Token(&local_678,sVar9,sVar2,*pvVar6,Stop);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,&local_678);
                  std::
                  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                  ::pop((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                         *)&index);
                  local_320 = start + 1;
                  start = local_320;
                }
                else {
                  start = start + 1;
                }
              }
              else {
                local_320 = start + 1;
                start = local_320;
              }
            }
            else {
              local_320 = start + 1;
              start = local_320;
            }
            goto LAB_00108365;
          }
          if (local_320 < start) {
            Token::Token(&local_458,local_320,start - 1,Operand,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_458);
            local_320 = start;
          }
          bVar10 = std::
                   stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                   ::empty((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                            *)&index);
          sVar2 = start;
          sVar9 = local_320;
          if (bVar10) {
            local_47a = 1;
            piVar3 = (invalid_formula *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_478,"Mismatched braces",&local_479);
            invalid_formula::invalid_formula(piVar3,&local_478);
            local_47a = 0;
            __cxa_throw(piVar3,&invalid_formula::typeinfo,invalid_formula::~invalid_formula);
          }
          pvVar6 = std::
                   stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                   ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                          *)&index);
          Token::Token(&local_498,sVar9,sVar2,*pvVar6,Stop);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_498);
          std::
          stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
          ::pop((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                 *)&index);
          sVar2 = start;
          sVar9 = local_320;
          pvVar6 = std::
                   stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                   ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                          *)&index);
          Token::Token(&local_4b0,sVar9,sVar2,*pvVar6,Stop);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_4b0);
          std::
          stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
          ::pop((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                 *)&index);
          local_320 = start + 1;
          start = local_320;
        }
      }
      else {
        for (local_340 = COMPARATORS_MULTI + 3; *local_340 != (char *)0x0; local_340 = local_340 + 1
            ) {
          pcVar1 = *local_340;
          sVar9 = _tcslen(pcVar1);
          bVar10 = _str_equals(pcVar1,sVar9,(char *)(size_local + local_320),(start - local_320) + 1
                              );
          if (bVar10) {
            Token::Token(&local_358,local_320,start,Operand,Error);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_358);
            local_320 = start + 1;
            stack.c.
            super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ = 0;
            break;
          }
        }
        start = start + 1;
      }
      goto LAB_00108365;
    }
    if (*(char *)(size_local + start) == local_6a) {
      stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_node._5_1_ = 0;
    }
    start = start + 1;
  } while( true );
}

Assistant:

inline std::vector<Token> tokenize(const char_type *formula, size_t size, const Options<char_type>& options)
    {
        // Basic checks to make sure it's a valid formula
        if (size < 2 || formula[0] != '=')
            throw invalid_formula("Invalid Excel formula");

        // Chars used in parsing excel formual
        const char_type QUOTE_DOUBLE  = XLFP_CHAR('"');
        const char_type QUOTE_SINGLE  = XLFP_CHAR('\'');
        const char_type PAREN_OPEN    = XLFP_CHAR('(');
        const char_type PAREN_CLOSE   = XLFP_CHAR(')');
        const char_type WHITESPACE    = XLFP_CHAR(' ');
        const char_type ERROR_START   = XLFP_CHAR('#');

        // Some chars can be changed in the options
        const auto left_brace = options.left_brace.value_or(XLFP_CHAR('{'));
        const auto right_brace = options.right_brace.value_or(XLFP_CHAR('}'));
        const auto left_bracket = options.left_bracket.value_or(XLFP_CHAR('['));
        const auto right_bracket = options.right_brace.value_or(XLFP_CHAR(']'));
        const auto list_separator = options.list_separator.value_or(XLFP_CHAR(','));
        const auto decimal_separator = options.decimal_separator.value_or(XLFP_CHAR('.'));
        const auto row_separator = options.row_separator.value_or(XLFP_CHAR(';'));

        const char_type* OPERATORS_INFIX   = XLFP_STRING("+-*/^&=><@");
        const char_type* OPERATORS_POSTFIX = XLFP_STRING("%");

        // This matches a number in scientific notation with or without numbers after the + or -.
        // It's used to test for SN numbers before checking for +/- operators.
        std::basic_stringstream<char_type> sn_regex_ss;
        sn_regex_ss << R"(^[1-9](\)" << decimal_separator << R"(\d+)?E[+-]\d*$)";
        const std::basic_regex<char_type> sn_regex(sn_regex_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        const char_type* ERRORS[] = {
                XLFP_STRING("#NULL!"),
                XLFP_STRING("#DIV/0!"),
                XLFP_STRING("#VALUE!"),
                XLFP_STRING("#REF!"),
                XLFP_STRING("#NAME?"),
                XLFP_STRING("#NUM!"),
                XLFP_STRING("#N/A"),
                XLFP_STRING("#SPILL!"),
                NULL
        };

        const char_type* COMPARATORS_MULTI[] = {
                XLFP_STRING(">="),
                XLFP_STRING("<="),
                XLFP_STRING("<>"),
                NULL
        };

        bool in_string = false;
        bool in_path = false;
        bool in_range = false;
        bool in_error = false;

        std::vector<Token> tokens;
        std::stack<Token::Type> stack;

        size_t index = 1;  // first char is always '='
        size_t start = index;  // start of the current token
        while(index < size && formula[index] != L'\0')
        {
            // state-dependent character evaluation (order is important)

            // double-quoted strings
            // embeds are doubled
            // end marks token
            if (in_string) {
                if (formula[index] == QUOTE_DOUBLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_DOUBLE))
                    {
                        // '""' is a quoted '"' so skip both
                        index += 2;
                        continue;
                    }

                    // add the string token, exit the string and continue
                    tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Text));
                    start = ++index;
                    in_string = false;
                    continue;
                }

                ++index;
                continue;
            }

            // single-quoted strings (links)
            // embeds are double
            // end does not mark a token
            if (in_path)
            {
                if (formula[index] == QUOTE_SINGLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_SINGLE))
                    {
                        // '' is a quoted ' so skip both
                        index += 2;
                        continue;
                    }

                    in_path = false;
                }

                ++index;
                continue;
            }

            // bracketed strings (R1C1 range index or linked workbook name)
            // no embeds (changed to "()" by Excel)
            // end does not mark a token
            if (in_range)
            {
                if (formula[index] == right_bracket)
                    in_range = false;

                index++;
                continue;
            }

            // error values
            // end marks a token, determined from absolute list of values
            if (in_error)
            {
                for (auto err = &ERRORS[0]; *err != NULL; ++err)
                {
                    if (_str_equals(*err, _tcslen(*err), &formula[start], 1 + index - start))
                    {
                        // add the string token, exit the string and continue
                        tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Error));
                        start = index + 1;
                        in_error = false;
                        break;
                    }
                }

                ++index;
                continue;
            }

            // scientific notation check
            if (index > start)
            {
                if (std::regex_match(&formula[start], &formula[index]+1, sn_regex))
                {
                    ++index;
                    continue;
                }
            }

            // independent character evaluation (order not important)
            // establish state-dependent character evaluations
            if (formula[index] == QUOTE_DOUBLE) {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_string = true;
                ++index;
                continue;
            }

            if (formula[index] == QUOTE_SINGLE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_path = true;
                ++index;
                continue;
            }

            if (formula[index] == left_bracket)
            {
                in_range = true;
                ++index;
                continue;
            }

            if (formula[index] == ERROR_START)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_error = true;
                ++index;
                continue;
            }

            // mark start and end of arrays and array rows
            if (formula[index] == left_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, Token::Type::Array, Token::Subtype::Start));
                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));

                stack.push(Token::Type::Array);
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == row_separator && !stack.empty() && stack.top() == Token::Type::ArrayRow)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == right_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched braces");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // trim white-space
            if (formula[index] == WHITESPACE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                while ((formula[index] == WHITESPACE) && (index < size))
                    index++;

                tokens.push_back(Token(start, index-1, Token::Type::Whitespace, Token::Subtype::None));

                start = index;
                continue;
            }

            // multi-character comparators
            if ((index + 2) <= size)
            {
                bool foundOp = false;
                for (auto op = &COMPARATORS_MULTI[0]; *op != NULL; ++op)
                {
                    if (_str_equals(*op, _tcslen(*op), &formula[index], 2))
                    {
                        if (index > start)
                        {
                            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                            start = index;
                        }

                        tokens.push_back(Token(start, index+1, Token::Type::OperatorInfix, Token::Subtype::Logical));
                        foundOp = true;
                        break;
                    }
                }

                if (foundOp)
                {
                    index += 2;
                    start = index;
                    continue;
                }
            }

            // standard infix operators
            bool foundOp = false;
            for (auto op = OPERATORS_INFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorInfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // standard postfix operators
            for (auto op = OPERATORS_POSTFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorPostfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // start subexpression or function
            if (formula[index] == PAREN_OPEN)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Function, Token::Subtype::Start));
                    stack.push(Token::Type::Function);
                }
                else
                {
                    tokens.push_back(Token(start, index, Token::Type::Subexpression, Token::Subtype::Start));
                    stack.push(Token::Type::Subexpression);
                }

                start = ++index;
                continue;
            }

            // function, subexpression, or array parameters, or operand unions
            if (formula[index] == list_separator)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                auto type = (!stack.empty() && stack.top() == Token::Type::Function)
                                ? std::make_tuple(Token::Type::Argument, Token::Subtype::None)
                                : std::make_tuple(Token::Type::OperatorInfix, Token::Subtype::Union);

                tokens.push_back(Token(start, index, std::get<0>(type), std::get<1>(type)));

                start = ++index;
                continue;
            }

            // stop subexpression
            if (formula[index] == PAREN_CLOSE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched parentheses");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // token accumulation
            ++index;
        }

        // dump remaining accumulation, if any
        if (index > start && (tokens.empty() || tokens.back().end() < start))
            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));

        // label intersection operators specified as whitespace correctly
        tokens = _fix_whitespace_tokens(tokens, formula, size);

        // set the token subtypes correctly
        _infer_token_subtypes(tokens, options, formula, size);

        return tokens;
    }